

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O1

bool __thiscall
duckdb_re2::NFA::Search
          (NFA *this,StringPiece *text,StringPiece *const_context,bool anchored,bool longest,
          StringPiece *submatch,int nsubmatch)

{
  iterator *piVar1;
  size_t __n;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  Inst *pIVar6;
  long lVar7;
  long lVar8;
  const_pointer pcVar9;
  uint uVar10;
  char **ppcVar11;
  Threadq *pTVar12;
  IndexValue *pIVar13;
  uint uVar14;
  ulong uVar15;
  Threadq *nextq;
  long lVar16;
  Thread *pTVar17;
  byte *p;
  size_t sVar18;
  byte *pbVar19;
  _Elt_pointer pTVar20;
  StringPiece context;
  Threadq *local_1e8;
  StringPiece local_1d8;
  deque<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_> *local_1c8;
  StringPiece *local_1c0;
  StringPiece *local_1b8;
  undefined1 local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  if (this->start_ == 0) {
    return (bool)'\0';
  }
  local_1d8.data_ = const_context->data_;
  local_1d8.size_ = const_context->size_;
  if ((byte *)local_1d8.data_ == (byte *)0x0) {
    local_1d8.data_ = text->data_;
    local_1d8.size_ = text->size_;
  }
  pcVar9 = local_1d8.data_;
  p = (byte *)text->data_;
  if (local_1d8.data_ <= p) {
    pbVar19 = p + text->size_;
    if (pbVar19 <= local_1d8.data_ + local_1d8.size_) {
      bVar2 = this->prog_->anchor_start_;
      if (((byte *)local_1d8.data_ != p & bVar2) != 0) {
        return (bool)'\0';
      }
      bVar3 = this->prog_->anchor_end_;
      if (((byte *)(local_1d8.data_ + local_1d8.size_) != pbVar19 & bVar3) != 0) {
        return (bool)'\0';
      }
      if (bVar3 != false) {
        this->endmatch_ = true;
        longest = true;
      }
      if (-1 < nsubmatch) {
        this->ncapture_ = nsubmatch * 2;
        this->longest_ = longest;
        if (nsubmatch == 0) {
          this->ncapture_ = 2;
        }
        __n = (long)this->ncapture_ * 8;
        sVar18 = __n;
        if ((long)this->ncapture_ < 0) {
          sVar18 = 0xffffffffffffffff;
        }
        local_1c0 = submatch;
        local_1b8 = text;
        ppcVar11 = (char **)operator_new__(sVar18);
        this->match_ = ppcVar11;
        memset(ppcVar11,0,__n);
        this->matched_ = false;
        this->btext_ = pcVar9;
        this->etext_ = (char *)pbVar19;
        local_1e8 = &this->q0_;
        (this->q0_).size_ = 0;
        (this->q1_).size_ = 0;
        local_1c8 = &this->arena_;
        nextq = &this->q1_;
        do {
          uVar10 = 0xffffffff;
          if (p < this->etext_) {
            uVar10 = (uint)*p;
          }
          uVar10 = Step(this,local_1e8,nextq,uVar10,&local_1d8,(char *)p);
          local_1e8->size_ = 0;
          pbVar19 = (byte *)this->etext_;
          pTVar12 = local_1e8;
          if (uVar10 == 0) {
            if (pbVar19 < p) {
              bVar3 = false;
            }
            else {
              if (this->matched_ == false) {
                if (bVar2 == false && !anchored) {
                  if ((((p < pbVar19) && (nextq->size_ == 0)) && (this->prog_->prefix_size_ != 0))
                     && (p = (byte *)Prog::PrefixAccel(this->prog_,p,(long)pbVar19 - (long)p),
                        p == (byte *)0x0)) {
                    p = (byte *)this->etext_;
                  }
                }
                else if (p != (byte *)local_1b8->data_) goto LAB_00491683;
                pTVar17 = this->freelist_;
                if (pTVar17 == (Thread *)0x0) {
                  pTVar20 = (this->arena_).
                            super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
                  if (pTVar20 ==
                      (this->arena_).
                      super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                    std::deque<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>::
                    _M_push_back_aux<>(local_1c8);
                  }
                  else {
                    (pTVar20->field_0).next = (Thread *)0x0;
                    pTVar20->capture = (char **)0x0;
                    piVar1 = &(this->arena_).
                              super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>
                              ._M_impl.super__Deque_impl_data._M_finish;
                    piVar1->_M_cur = piVar1->_M_cur + 1;
                  }
                  pTVar20 = (this->arena_).
                            super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
                  if (pTVar20 ==
                      (this->arena_).
                      super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                    pTVar20 = (this->arena_).
                              super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
                  }
                  pTVar17 = pTVar20 + -1;
                  pTVar20[-1].field_0.ref = 1;
                  uVar15 = (long)this->ncapture_ * 8;
                  if ((long)this->ncapture_ < 0) {
                    uVar15 = 0xffffffffffffffff;
                  }
                  ppcVar11 = (char **)operator_new__(uVar15);
                  pTVar20[-1].capture = ppcVar11;
                }
                else {
                  this->freelist_ = (Thread *)pTVar17->field_0;
                  (pTVar17->field_0).ref = 1;
                }
                memmove(pTVar17->capture,this->match_,(long)this->ncapture_ << 3);
                *pTVar17->capture = (char *)p;
                uVar10 = 0xffffffff;
                if (p < this->etext_) {
                  uVar10 = (uint)*p;
                }
                AddToThreadq(this,nextq,this->start_,uVar10,&local_1d8,(char *)p,pTVar17);
                iVar5 = (pTVar17->field_0).ref;
                (pTVar17->field_0).ref = iVar5 + -1;
                if (iVar5 < 2) {
                  pTVar17->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->freelist_;
                  this->freelist_ = pTVar17;
                }
              }
LAB_00491683:
              if (nextq->size_ == 0) {
                bVar3 = false;
              }
              else {
                bVar3 = true;
                if (p == (byte *)0x0) {
                  bVar3 = false;
                  Step(this,nextq,local_1e8,-1,&local_1d8,(char *)0x0);
                  nextq->size_ = 0;
                  p = (byte *)0x0;
                  pTVar12 = nextq;
                  nextq = local_1e8;
                }
              }
            }
          }
          else {
            do {
              pIVar6 = ((_Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false> *)
                       ((long)&(this->prog_->inst_).ptr_._M_t.
                               super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                               ._M_t.
                               super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                       + 8))->_M_head_impl;
              uVar4 = pIVar6[(int)uVar10].out_opcode_;
              uVar14 = uVar4 & 7;
              if (uVar14 == 3) {
                if (pIVar6[(int)uVar10].field_1.cap_ < this->ncapture_) {
                  this->match_[pIVar6[(int)uVar10].field_1.cap_] = (char *)pbVar19;
                }
LAB_004914d1:
                uVar10 = uVar4 >> 4;
                bVar3 = true;
              }
              else {
                if (uVar14 == 5) {
                  this->match_[1] = (char *)pbVar19;
                  this->matched_ = true;
                }
                else {
                  if (uVar14 == 6) goto LAB_004914d1;
                  local_1b0 = 0;
                  std::__cxx11::ostringstream::ostringstream(local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"Unexpected opcode in short circuit: ",0x24);
                  std::ostream::operator<<(local_1a8,pIVar6[(int)uVar10].out_opcode_ & 7);
                  std::__cxx11::ostringstream::~ostringstream(local_1a8);
                  std::ios_base::~ios_base(local_138);
                }
                bVar3 = false;
              }
            } while (bVar3);
            bVar3 = false;
            p = pbVar19;
          }
          local_1e8 = nextq;
          p = p + 1;
          nextq = pTVar12;
          if (!bVar3) {
            if (local_1e8->size_ != 0) {
              pIVar13 = (local_1e8->dense_).ptr_._M_t.
                        super___uniq_ptr_impl<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
                        .
                        super__Head_base<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_false>
                        ._M_head_impl;
              do {
                pTVar17 = pIVar13->value_;
                if ((pTVar17 != (Thread *)0x0) &&
                   (iVar5 = (pTVar17->field_0).ref, (pTVar17->field_0).ref = iVar5 + -1, iVar5 < 2))
                {
                  pTVar17->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->freelist_;
                  this->freelist_ = pTVar17;
                }
                pIVar13 = pIVar13 + 1;
              } while (pIVar13 !=
                       (local_1e8->dense_).ptr_._M_t.
                       super___uniq_ptr_impl<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
                       .
                       super__Head_base<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_false>
                       ._M_head_impl + local_1e8->size_);
            }
            bVar2 = this->matched_;
            if (nsubmatch != 0 && bVar2 == true) {
              uVar15 = 1;
              if (1 < nsubmatch) {
                uVar15 = (ulong)(uint)nsubmatch;
              }
              lVar16 = 0;
              do {
                lVar7 = *(long *)((long)this->match_ + lVar16);
                lVar8 = *(long *)((long)this->match_ + lVar16 + 8);
                *(long *)((long)&local_1c0->data_ + lVar16) = lVar7;
                *(long *)((long)&local_1c0->size_ + lVar16) = lVar8 - lVar7;
                lVar16 = lVar16 + 0x10;
              } while (uVar15 * 0x10 != lVar16);
              return bVar2;
            }
            return bVar2;
          }
        } while( true );
      }
      local_1b0 = 0;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Bad args: nsubmatch=",0x14);
      std::ostream::operator<<(local_1a8,nsubmatch);
      goto LAB_004912ef;
    }
  }
  local_1b0 = 0;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"context does not contain text",0x1d);
LAB_004912ef:
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool NFA::Search(const StringPiece& text, const StringPiece& const_context,
            bool anchored, bool longest,
            StringPiece* submatch, int nsubmatch) {
  if (start_ == 0)
    return false;

  StringPiece context = const_context;
  if (context.data() == NULL)
    context = text;

  // Sanity check: make sure that text lies within context.
  if (BeginPtr(text) < BeginPtr(context) || EndPtr(text) > EndPtr(context)) {
    LOG(DFATAL) << "context does not contain text";
    return false;
  }

  if (prog_->anchor_start() && BeginPtr(context) != BeginPtr(text))
    return false;
  if (prog_->anchor_end() && EndPtr(context) != EndPtr(text))
    return false;
  anchored |= prog_->anchor_start();
  if (prog_->anchor_end()) {
    longest = true;
    endmatch_ = true;
  }

  if (nsubmatch < 0) {
    LOG(DFATAL) << "Bad args: nsubmatch=" << nsubmatch;
    return false;
  }

  // Save search parameters.
  ncapture_ = 2*nsubmatch;
  longest_ = longest;

  if (nsubmatch == 0) {
    // We need to maintain match[0], both to distinguish the
    // longest match (if longest is true) and also to tell
    // whether we've seen any matches at all.
    ncapture_ = 2;
  }

  match_ = new const char*[ncapture_];
  memset(match_, 0, ncapture_*sizeof match_[0]);
  matched_ = false;

  // For debugging prints.
  btext_ = context.data();
  // For convenience.
  etext_ = text.data() + text.size();

  // Set up search.
  Threadq* runq = &q0_;
  Threadq* nextq = &q1_;
  runq->clear();
  nextq->clear();

  // Loop over the text, stepping the machine.
  for (const char* p = text.data();; p++) {
    // This is a no-op the first time around the loop because runq is empty.
    int id = Step(runq, nextq, p < etext_ ? p[0] & 0xFF : -1, context, p);
    DCHECK_EQ(runq->size(), 0);
    using std::swap;
    swap(nextq, runq);
    nextq->clear();
    if (id != 0) {
      // We're done: full match ahead.
      p = etext_;
      for (;;) {
        Prog::Inst* ip = prog_->inst(id);
        switch (ip->opcode()) {
          default:
            LOG(DFATAL) << "Unexpected opcode in short circuit: " << ip->opcode();
            break;

          case kInstCapture:
            if (ip->cap() < ncapture_)
              match_[ip->cap()] = p;
            id = ip->out();
            continue;

          case kInstNop:
            id = ip->out();
            continue;

          case kInstMatch:
            match_[1] = p;
            matched_ = true;
            break;
        }
        break;
      }
      break;
    }

    if (p > etext_)
      break;

    // Start a new thread if there have not been any matches.
    // (No point in starting a new thread if there have been
    // matches, since it would be to the right of the match
    // we already found.)
    if (!matched_ && (!anchored || p == text.data())) {
      // Try to use prefix accel (e.g. memchr) to skip ahead.
      // The search must be unanchored and there must be zero
      // possible matches already.
      if (!anchored && runq->size() == 0 &&
          p < etext_ && prog_->can_prefix_accel()) {
        p = reinterpret_cast<const char*>(prog_->PrefixAccel(p, etext_ - p));
        if (p == NULL)
          p = etext_;
      }

      Thread* t = AllocThread();
      CopyCapture(t->capture, match_);
      t->capture[0] = p;
      AddToThreadq(runq, start_, p < etext_ ? p[0] & 0xFF : -1, context, p,
                   t);
      Decref(t);
    }

    // If all the threads have died, stop early.
    if (runq->size() == 0) {
      break;
    }

    // Avoid invoking undefined behavior (arithmetic on a null pointer)
    // by simply not continuing the loop.
    // This complements the special case in NFA::Step().
    if (p == NULL) {
      (void) Step(runq, nextq, -1, context, p);
      DCHECK_EQ(runq->size(), 0);
      using std::swap;
      swap(nextq, runq);
      nextq->clear();
      break;
    }
  }

  for (Threadq::iterator i = runq->begin(); i != runq->end(); ++i) {
    if (i->value() != NULL)
      Decref(i->value());
  }

  if (matched_) {
    for (int i = 0; i < nsubmatch; i++)
      submatch[i] =
          StringPiece(match_[2 * i],
                      static_cast<size_t>(match_[2 * i + 1] - match_[2 * i]));
    return true;
  }
  return false;
}